

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O1

void LiteScript::StateExecutor::I_OP_GREAT(State *state,Instruction *instr)

{
  pointer pVVar1;
  Variable result;
  Variable v1;
  Variable v2;
  Variable VStack_38;
  Variable local_28;
  Variable local_18;
  
  state->line_num = state->line_num + 1;
  pVVar1 = (state->op_lifo).
           super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0x10 < (ulong)((long)pVVar1 -
                    (long)(state->op_lifo).
                          super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    Variable::Variable(&local_18,pVVar1 + -1);
    PopValue(state);
    Variable::Variable(&local_28,
                       (state->op_lifo).
                       super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                       ._M_impl.super__Vector_impl_data._M_finish + -1);
    PopValue(state);
    Variable::operator>(&VStack_38,&local_28);
    std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>::push_back
              (&state->op_lifo,&VStack_38);
    Variable::~Variable(&VStack_38);
    Variable::~Variable(&local_28);
    Variable::~Variable(&local_18);
  }
  return;
}

Assistant:

void LiteScript::StateExecutor::I_OP_GREAT(State& state, Instruction& instr) {
    state.line_num++;
    if (state.op_lifo.size() < 2)
        return;
    Variable v2(state.op_lifo.back());
    PopValue(state);
    Variable v1(state.op_lifo.back());
    PopValue(state);
    Variable result = (v1 > v2);
    state.op_lifo.push_back(result);
}